

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerJob.h
# Opt level: O2

void __thiscall
xmrig::WorkerJob<1UL>::save(WorkerJob<1UL> *this,Job *job,uint32_t reserveCount,Backend backend)

{
  byte bVar1;
  uint32_t uVar2;
  undefined4 in_register_00000014;
  
  bVar1 = job->m_index;
  this->m_index = bVar1;
  Job::copy(this->m_jobs + bVar1,(EVP_PKEY_CTX *)job,
            (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,reserveCount));
  bVar1 = this->m_index;
  this->m_rounds[bVar1] = 0;
  this->m_jobs[bVar1].m_backend = backend;
  memcpy(this->m_blobs + bVar1,job->m_blob,job->m_size);
  uVar2 = Nonce::next(this->m_index,*(uint32_t *)(this->m_blobs[this->m_index] + 0x27),reserveCount)
  ;
  *(uint32_t *)(this->m_blobs[this->m_index] + 0x27) = uVar2;
  return;
}

Assistant:

inline void xmrig::WorkerJob<1>::save(const Job &job, uint32_t reserveCount, Nonce::Backend backend)
{
    m_index           = job.index();
    m_jobs[index()]   = job;
    m_rounds[index()] = 0;

    m_jobs[index()].setBackend(backend);

    memcpy(blob(), job.blob(), job.size());
    *nonce() = Nonce::next(index(), *nonce(), reserveCount);
}